

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.cpp
# Opt level: O2

void __thiscall
TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::AddKel
          (TPZParFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_> *this,
          TPZFMatrix<double> *elmat,TPZVec<long> *destinationindex)

{
  TPZFrontSym<double> *this_00;
  DecomposeType DVar1;
  TPZEqnArray<double> *this_01;
  ostream *poVar2;
  int64_t maxeq;
  int64_t mineq;
  long local_38;
  long local_30;
  
  this_00 = &(this->super_TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>).
             fFront;
  TPZFrontSym<double>::AddKel(this_00,elmat,destinationindex);
  TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::EquationsToDecompose
            (&this->super_TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>,
             destinationindex,&local_30,&local_38);
  if (local_30 <= local_38) {
    this_01 = (TPZEqnArray<double> *)operator_new(0x3290);
    TPZEqnArray<double>::TPZEqnArray(this_01);
    TPZFrontSym<double>::DecomposeEquations(this_00,local_30,local_38,this_01);
    TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>::CheckCompress
              (&this->super_TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>
              );
    std::mutex::lock(&this->fwritelock);
    TPZStack<TPZEqnArray<double>_*,_10>::Push(&this->fEqnStack,this_01);
    if (local_38 ==
        (this->super_TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>).
        super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + -1)
    {
      poVar2 = std::operator<<((ostream *)&std::cout,"Decomposition finished");
      std::endl<char,std::char_traits<char>>(poVar2);
      std::ostream::flush();
      FinishWriting(this);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->fwritelock);
    std::condition_variable::notify_all();
  }
  DVar1 = TPZFrontSym<double>::GetDecomposeType(this_00);
  (this->super_TPZFrontMatrix<double,_TPZStackEqnStorage<double>,_TPZFrontSym<double>_>).
  super_TPZAbstractFrontMatrix<double>.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed =
       (char)DVar1;
  return;
}

Assistant:

void TPZParFrontMatrix<TVar, store, front>::AddKel(TPZFMatrix<TVar> & elmat, TPZVec < int64_t > & destinationindex)
{
	
	// message #1.3 to fFront:TPZFront
	this->fFront.AddKel(elmat, destinationindex);
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Frondwidth after AddKel "<< this->fFront.FrontSize();
		LOGPZ_INFO(loggerfw,sout.str())
	}
#endif

	int64_t mineq, maxeq;
	this->EquationsToDecompose(destinationindex, mineq, maxeq);
	if(maxeq >= mineq) {

		TPZEqnArray<TVar> *AuxEqn = new TPZEqnArray<TVar>;
		
		this->fFront.DecomposeEquations(mineq,maxeq,*AuxEqn);
		this->CheckCompress();
        {
            std::lock_guard<std::mutex> lock(fwritelock);
            fEqnStack.Push(AuxEqn);
            if(maxeq == this->Rows()-1){
                cout << "Decomposition finished" << endl;
                cout.flush();
                FinishWriting();
                //fStorage.ReOpen();
            }
        }
        fwritecond.notify_all();
	}
	this->fDecomposed = this->fFront.GetDecomposeType();
}